

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_3::DBIter::ClearSavedValue(DBIter *this)

{
  pointer pcVar1;
  string empty;
  undefined1 *local_28;
  undefined8 local_20;
  undefined1 local_18 [16];
  
  pcVar1 = (this->saved_value_)._M_dataplus._M_p;
  if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)pcVar1 != &(this->saved_value_).field_2) &&
     (0x100000 < (this->saved_value_).field_2._M_allocated_capacity)) {
    local_28 = local_18;
    local_20 = 0;
    local_18[0] = 0;
    std::__cxx11::string::swap((string *)&local_28);
    std::__cxx11::string::_M_dispose();
    return;
  }
  (this->saved_value_)._M_string_length = 0;
  *pcVar1 = '\0';
  return;
}

Assistant:

inline void ClearSavedValue() {
    if (saved_value_.capacity() > 1048576) {
      std::string empty;
      swap(empty, saved_value_);
    } else {
      saved_value_.clear();
    }
  }